

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

void __thiscall QCompleterPrivate::showPopup(QCompleterPrivate *this,QRect *rect)

{
  uint uVar1;
  long lVar2;
  LayoutDirection LVar3;
  int iVar4;
  int iVar5;
  Representation RVar6;
  QAbstractItemModel *pQVar7;
  QScrollBar *pQVar8;
  int extraout_var;
  QPoint QVar9;
  QSize QVar10;
  int iVar11;
  int iVar12;
  Representation RVar13;
  int iVar14;
  Representation RVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  int local_64;
  QRect local_50;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::screen((QWidget *)(this->widget).wp.value);
  auVar16 = QScreen::availableGeometry();
  LVar3 = QWidget::layoutDirection((QWidget *)(this->widget).wp.value);
  iVar4 = (**(code **)(*(long *)&(this->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget
                      + 0x1f8))(this->popup,0);
  pQVar7 = QAbstractItemView::model((QAbstractItemView *)this->popup);
  local_50.x1.m_i = -1;
  local_50.y1.m_i = -1;
  local_50.x2.m_i = 0;
  local_50.y2.m_i = 0;
  uStack_40 = 0;
  iVar5 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7);
  if (this->maxVisibleItems < iVar5) {
    iVar5 = this->maxVisibleItems;
  }
  iVar5 = iVar5 * iVar4 + 6;
  pQVar8 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this->popup);
  if ((pQVar8 != (QScrollBar *)0x0) &&
     ((((pQVar8->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0)) {
    pQVar8 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this->popup);
    (**(code **)(*(long *)&(pQVar8->super_QAbstractSlider).super_QWidget + 0x70))(pQVar8);
    iVar5 = iVar5 + extraout_var;
  }
  iVar4 = (rect->x1).m_i;
  local_64 = (rect->y1).m_i;
  iVar14 = (rect->x2).m_i;
  uVar1 = (rect->y2).m_i;
  local_50.x1.m_i = (rect->x2).m_i;
  local_50.y1.m_i = (rect->y2).m_i;
  if ((int)uVar1 < local_64 || iVar14 < iVar4) {
    lVar2 = *(long *)((this->widget).wp.value + 0x20);
    local_64 = ~*(uint *)(lVar2 + 0x20) + *(int *)(lVar2 + 0x18);
    lVar2 = *(long *)((this->widget).wp.value + 0x20);
    local_50._0_8_ = (ulong)(~*(uint *)(lVar2 + 0x18) + *(int *)(lVar2 + 0x20)) << 0x20;
    QVar9 = QWidget::mapToGlobal((QWidget *)(this->widget).wp.value,(QPoint *)&local_50);
    lVar2 = *(long *)((this->widget).wp.value + 0x20);
    iVar14 = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  }
  else {
    local_64 = local_64 + ~uVar1;
    iVar14 = iVar14 - iVar4;
    if (LVar3 != RightToLeft) {
      local_50._0_8_ = CONCAT44(uVar1,iVar4);
    }
    QVar9 = QWidget::mapToGlobal((QWidget *)(this->widget).wp.value,(QPoint *)&local_50);
  }
  RVar13.m_i = (int)QVar9.yp.m_i;
  iVar11 = auVar16._8_4_ + 1;
  iVar12 = auVar16._0_4_;
  iVar4 = iVar11 - iVar12;
  if (iVar14 + 1 < iVar11 - iVar12) {
    iVar4 = iVar14 + 1;
  }
  RVar15.m_i = iVar11 - iVar4;
  if (iVar4 + QVar9.xp.m_i.m_i <= iVar11) {
    RVar15.m_i = QVar9.xp.m_i.m_i;
  }
  if (RVar15.m_i <= iVar12) {
    RVar15.m_i = iVar12;
  }
  iVar14 = auVar16._12_4_ - RVar13.m_i;
  QVar10 = QWidget::minimumSize((QWidget *)this->popup);
  RVar6.m_i = QVar10.ht.m_i.m_i;
  if (QVar10.ht.m_i.m_i < iVar5) {
    RVar6.m_i = iVar5;
  }
  if (iVar14 < RVar6.m_i) {
    iVar11 = (local_64 - auVar16._4_4_) + RVar13.m_i + 2;
    iVar5 = iVar14;
    if (iVar14 < iVar11) {
      iVar5 = iVar11;
    }
    if (RVar6.m_i <= iVar5) {
      iVar5 = RVar6.m_i;
    }
    RVar6.m_i = iVar5;
    if (iVar14 < iVar11) {
      RVar13.m_i = ((local_64 + RVar13.m_i) - iVar5) + 2;
    }
  }
  local_50.y1.m_i = RVar13.m_i;
  local_50.x1.m_i = RVar15.m_i;
  local_50.y2.m_i = RVar6.m_i + RVar13.m_i + -1;
  local_50.x2.m_i = iVar4 + RVar15.m_i + -1;
  QWidget::setGeometry((QWidget *)this->popup,&local_50);
  if ((((QWidget *)this->popup)->data->widget_attributes & 0x8000) == 0) {
    QWidget::show((QWidget *)this->popup);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleterPrivate::showPopup(const QRect& rect)
{
    const QRect screen = widget->screen()->availableGeometry();
    Qt::LayoutDirection dir = widget->layoutDirection();
    QPoint pos;
    int rh, w;
    int h = (popup->sizeHintForRow(0) * qMin(maxVisibleItems, popup->model()->rowCount()) + 3) + 3;
    QScrollBar *hsb = popup->horizontalScrollBar();
    if (hsb && hsb->isVisible())
        h += popup->horizontalScrollBar()->sizeHint().height();

    if (rect.isValid()) {
        rh = rect.height();
        w = rect.width();
        pos = widget->mapToGlobal(dir == Qt::RightToLeft ? rect.bottomRight() : rect.bottomLeft());
    } else {
        rh = widget->height();
        pos = widget->mapToGlobal(QPoint(0, widget->height() - 2));
        w = widget->width();
    }

    if (w > screen.width())
        w = screen.width();
    if ((pos.x() + w) > (screen.x() + screen.width()))
        pos.setX(screen.x() + screen.width() - w);
    if (pos.x() < screen.x())
        pos.setX(screen.x());

    int top = pos.y() - rh - screen.top() + 2;
    int bottom = screen.bottom() - pos.y();
    h = qMax(h, popup->minimumHeight());
    if (h > bottom) {
        h = qMin(qMax(top, bottom), h);

        if (top > bottom)
            pos.setY(pos.y() - h - rh + 2);
    }

    popup->setGeometry(pos.x(), pos.y(), w, h);

    if (!popup->isVisible())
        popup->show();
}